

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_sse2.c
# Opt level: O2

void aom_highbd_convolve_copy_sse2
               (uint16_t *src,ptrdiff_t src_stride,uint16_t *dst,ptrdiff_t dst_stride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  
  if (w == 2) {
    do {
      *(undefined4 *)dst = *(undefined4 *)src;
      *(undefined4 *)(dst + dst_stride) = *(undefined4 *)(src + src_stride);
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 4) {
    do {
      uVar1 = *(undefined8 *)(src + src_stride);
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + dst_stride) = uVar1;
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 8) {
    do {
      uVar1 = *(undefined8 *)(src + 4);
      uVar2 = *(undefined8 *)(src + src_stride);
      uVar3 = *(undefined8 *)(src + src_stride + 4);
      *(undefined8 *)dst = *(undefined8 *)src;
      *(undefined8 *)(dst + 4) = uVar1;
      *(undefined8 *)(dst + dst_stride) = uVar2;
      *(undefined8 *)(dst + dst_stride + 4) = uVar3;
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 0x10) {
    do {
      uVar1 = *(undefined8 *)src;
      uVar2 = *(undefined8 *)(src + 4);
      uVar3 = *(undefined8 *)(src + 8);
      uVar4 = *(undefined8 *)(src + 0xc);
      uVar5 = *(undefined8 *)(src + src_stride);
      uVar6 = *(undefined8 *)(src + src_stride + 4);
      uVar7 = *(undefined8 *)(src + src_stride + 8);
      uVar8 = *(undefined8 *)(src + src_stride + 8 + 4);
      src = src + src_stride * 2;
      *(undefined8 *)dst = uVar1;
      *(undefined8 *)(dst + 4) = uVar2;
      *(undefined8 *)(dst + 8) = uVar3;
      *(undefined8 *)(dst + 0xc) = uVar4;
      *(undefined8 *)(dst + dst_stride) = uVar5;
      *(undefined8 *)(dst + dst_stride + 4) = uVar6;
      *(undefined8 *)(dst + dst_stride + 8) = uVar7;
      *(undefined8 *)(dst + dst_stride + 8 + 4) = uVar8;
      dst = dst + dst_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 0x20) {
    do {
      uVar1 = *(undefined8 *)src;
      uVar2 = *(undefined8 *)(src + 4);
      uVar3 = *(undefined8 *)(src + 8);
      uVar4 = *(undefined8 *)(src + 0xc);
      uVar5 = *(undefined8 *)(src + 0x10);
      uVar6 = *(undefined8 *)(src + 0x14);
      uVar7 = *(undefined8 *)(src + 0x18);
      uVar8 = *(undefined8 *)(src + 0x1c);
      uVar9 = *(undefined8 *)(src + src_stride);
      uVar10 = *(undefined8 *)(src + src_stride + 4);
      uVar11 = *(undefined8 *)(src + src_stride + 8);
      uVar12 = *(undefined8 *)(src + src_stride + 8 + 4);
      uVar13 = *(undefined8 *)(src + src_stride + 0x10);
      uVar14 = *(undefined8 *)(src + src_stride + 0x10 + 4);
      uVar15 = *(undefined8 *)(src + src_stride + 0x18);
      uVar16 = *(undefined8 *)(src + src_stride + 0x18 + 4);
      src = src + src_stride * 2;
      *(undefined8 *)dst = uVar1;
      *(undefined8 *)(dst + 4) = uVar2;
      *(undefined8 *)(dst + 8) = uVar3;
      *(undefined8 *)(dst + 0xc) = uVar4;
      *(undefined8 *)(dst + 0x10) = uVar5;
      *(undefined8 *)(dst + 0x14) = uVar6;
      *(undefined8 *)(dst + 0x18) = uVar7;
      *(undefined8 *)(dst + 0x1c) = uVar8;
      *(undefined8 *)(dst + dst_stride) = uVar9;
      *(undefined8 *)(dst + dst_stride + 4) = uVar10;
      *(undefined8 *)(dst + dst_stride + 8) = uVar11;
      *(undefined8 *)(dst + dst_stride + 8 + 4) = uVar12;
      *(undefined8 *)(dst + dst_stride + 0x10) = uVar13;
      *(undefined8 *)(dst + dst_stride + 0x10 + 4) = uVar14;
      *(undefined8 *)(dst + dst_stride + 0x18) = uVar15;
      *(undefined8 *)(dst + dst_stride + 0x18 + 4) = uVar16;
      dst = dst + dst_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else if (w == 0x40) {
    do {
      highbd_copy_64(src,dst);
      highbd_copy_64(src + src_stride,dst + dst_stride);
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  else {
    do {
      highbd_copy_128(src,dst);
      highbd_copy_128(src + src_stride,dst + dst_stride);
      dst = dst + dst_stride * 2;
      src = src + src_stride * 2;
      h = h + -2;
    } while (h != 0);
  }
  return;
}

Assistant:

void aom_highbd_convolve_copy_sse2(const uint16_t *src, ptrdiff_t src_stride,
                                   uint16_t *dst, ptrdiff_t dst_stride, int w,
                                   int h) {
  // The w >= 8 cases use _mm_store_si128(), which requires its output address
  // be aligned on a 16-byte boundary.
  if (w >= 8) {
    assert(!((intptr_t)dst % 16));
    assert(!(dst_stride % 8));
  }

  if (w == 2) {
    do {
      __m128i s = _mm_loadl_epi64((__m128i *)src);
      *(int *)dst = _mm_cvtsi128_si32(s);
      src += src_stride;
      dst += dst_stride;
      s = _mm_loadl_epi64((__m128i *)src);
      *(int *)dst = _mm_cvtsi128_si32(s);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 4) {
    do {
      __m128i s[2];
      s[0] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadl_epi64((__m128i *)src);
      src += src_stride;
      _mm_storel_epi64((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_storel_epi64((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 8) {
    do {
      __m128i s[2];
      s[0] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      s[1] = _mm_loadu_si128((__m128i *)src);
      src += src_stride;
      _mm_store_si128((__m128i *)dst, s[0]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)dst, s[1]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 16) {
    do {
      __m128i s[4];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      src += src_stride;
      s[2] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[3] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[2]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[3]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 32) {
    do {
      __m128i s[8];
      s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      s[2] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
      s[3] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
      src += src_stride;
      s[4] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
      s[5] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
      s[6] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
      s[7] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
      src += src_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
      _mm_store_si128((__m128i *)(dst + 2 * 8), s[2]);
      _mm_store_si128((__m128i *)(dst + 3 * 8), s[3]);
      dst += dst_stride;
      _mm_store_si128((__m128i *)(dst + 0 * 8), s[4]);
      _mm_store_si128((__m128i *)(dst + 1 * 8), s[5]);
      _mm_store_si128((__m128i *)(dst + 2 * 8), s[6]);
      _mm_store_si128((__m128i *)(dst + 3 * 8), s[7]);
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else if (w == 64) {
    do {
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_64(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  } else {
    do {
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      highbd_copy_128(src, dst);
      src += src_stride;
      dst += dst_stride;
      h -= 2;
    } while (h);
  }
}